

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O3

string * listThings(string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *things,bool articles)

{
  long lVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  stringstream ss;
  string local_228;
  string local_208;
  long local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pbVar4 = (things->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (things->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar3) {
    uVar5 = (long)pbVar3 - (long)pbVar4;
    lVar7 = ((long)uVar5 >> 5) + -1;
    if (lVar7 != 0) {
      lVar6 = 8;
      local_1e8 = lVar7;
      local_1e0 = __return_storage_ptr__;
      do {
        pbVar3 = (things->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (articles) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          lVar1 = *(long *)((long)pbVar3 + lVar6 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,lVar1,
                     *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6) + lVar1);
          getArticle(&local_228,&local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          pbVar3 = (things->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,*(char **)((long)pbVar3 + lVar6 + -8),
                   *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6));
        if (0x40 < (ulong)((long)(things->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(things->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        lVar6 = lVar6 + 0x20;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      pbVar4 = (things->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(things->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
      lVar7 = local_1e8;
      __return_storage_ptr__ = local_1e0;
    }
    if (0x20 < uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"and ",4);
      pbVar4 = (things->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    if (articles) {
      pcVar2 = pbVar4[lVar7]._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar2,pcVar2 + pbVar4[lVar7]._M_string_length);
      getArticle(&local_228,&local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = (things->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,pbVar4[lVar7]._M_dataplus._M_p,pbVar4[lVar7]._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string listThings(std::vector<std::string> things, bool articles) {
  std::stringstream ss;

  if(!things.empty()) {
    size_t lastIndex = things.size() - 1;
    for(size_t i = 0; i < lastIndex; i++) {
      if(articles) { ss << getArticle(things[i]); }
      ss << things[i];
      if(things.size() > 2) { ss << ","; }
      ss << " ";
      //if(i < lastIndex) { ss << ", "; }
    }

    if(things.size() > 1) { ss << "and "; }
    if(articles) { ss << getArticle(things[lastIndex]); }
    ss << things[lastIndex];
  }

  return ss.str();
}